

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

bool __thiscall anon_unknown.dwarf_8b8d2::P::parseInt(P *this,string *input,int64_t *out)

{
  int iVar1;
  pair<bool,_ccs::Value> pr;
  pair<bool,_ccs::Value> local_80;
  
  parseAndReturnValue(&local_80,this,input);
  if (local_80.first == true) {
    iVar1 = ::ccs::Value::asInt(&local_80.second);
    *out = (long)iVar1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.second.name_._M_dataplus._M_p != &local_80.second.name_.field_2) {
    operator_delete(local_80.second.name_._M_dataplus._M_p,
                    local_80.second.name_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.second.strVal_._M_dataplus._M_p != &local_80.second.strVal_.field_2) {
    operator_delete(local_80.second.strVal_._M_dataplus._M_p,
                    local_80.second.strVal_.field_2._M_allocated_capacity + 1);
  }
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector
            (&local_80.second.rawStringVal_.elements_);
  return local_80.first == true;
}

Assistant:

bool parseInt(const std::string &input, int64_t &out) {
    auto pr = parseAndReturnValue(input);
    if (!pr.first) return false;
    try {
      out = pr.second.asInt();
    } catch (ccs::bad_coercion &) {
      return false;
    }
    return true;
  }